

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

void __thiscall Image::Image(Image *this,string *filename)

{
  int iVar1;
  float *pfVar2;
  undefined8 *puVar3;
  string ext;
  int n;
  string local_38;
  int local_14;
  
  suffix(&local_38,filename);
  github111116::ConsoleLogger::log<char[15],std::__cxx11::string>
            (&console,(char (*) [15])"Loading image:",filename);
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 == 0) {
    LoadEXR_RGB(&this->pixels,&this->w,&this->h,(filename->_M_dataplus)._M_p);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_38);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_38);
        if (iVar1 != 0) {
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = "Image load: unrecognized format";
          __cxa_throw(puVar3,&char_const*::typeinfo,0);
        }
      }
    }
    pfVar2 = stbi_loadf((filename->_M_dataplus)._M_p,&this->w,&this->h,&local_14,3);
    this->pixels = pfVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Image(const std::string& filename) {
		std::string ext = suffix(filename);
		console.log("Loading image:", filename);
		if (ext == "exr") {
			LoadEXR_RGB(&pixels, &w, &h, filename.c_str());
			return;
		}
		if (ext == "hdr" || ext == "png" || ext == "jpg") {
			int n;
			pixels = stbi_loadf(filename.c_str(), &w, &h, &n, 3);
			return;
		}
		throw "Image load: unrecognized format";
	}